

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void singlesocket(Curl_multi *multi,SessionHandle *data)

{
  connectdata *conn;
  int iVar1;
  _Bool _Var2;
  uint uVar3;
  bool bVar4;
  connectdata *easy_conn;
  int j;
  int action;
  _Bool remove_sock_from_hash;
  uint curraction;
  int num;
  curl_socket_t s;
  Curl_sh_entry *entry;
  uint local_38;
  int i;
  curl_socket_t socks [5];
  SessionHandle *data_local;
  Curl_multi *multi_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < 5; entry._4_4_ = entry._4_4_ + 1) {
    (&local_38)[entry._4_4_] = 0xffffffff;
  }
  uVar3 = multi_getsock(data,(curl_socket_t *)&local_38,5);
  entry._4_4_ = 0;
  do {
    iVar1 = entry._4_4_;
    bVar4 = false;
    if (entry._4_4_ < 5) {
      bVar4 = (uVar3 & (1 << ((byte)entry._4_4_ & 0x1f) | 1 << ((byte)entry._4_4_ + 0x10 & 0x1f)))
              != 0;
    }
    if (!bVar4) {
      entry._4_4_ = 0;
      do {
        if (data->numsocks <= entry._4_4_) {
          memcpy(data->sockets,&local_38,(long)iVar1 << 2);
          data->numsocks = iVar1;
          return;
        }
        curraction = data->sockets[entry._4_4_];
        for (easy_conn._0_4_ = 0; (int)easy_conn < iVar1; easy_conn._0_4_ = (int)easy_conn + 1) {
          if (curraction == (&local_38)[(int)easy_conn]) {
            curraction = 0xffffffff;
            break;
          }
        }
        if (curraction != 0xffffffff) {
          bVar4 = true;
          _num = (Curl_sh_entry *)Curl_hash_pick(&multi->sockhash,&curraction,4);
          if (_num == (Curl_sh_entry *)0x0) {
            bVar4 = false;
          }
          else {
            conn = data->easy_conn;
            if (conn != (connectdata *)0x0) {
              if (((conn->recv_pipe != (curl_llist *)0x0) && (1 < conn->recv_pipe->size)) &&
                 (bVar4 = false, _num->easy == data)) {
                _Var2 = Curl_recvpipe_head(data,conn);
                if (_Var2) {
                  _num->easy = (SessionHandle *)conn->recv_pipe->head->next->ptr;
                }
                else {
                  _num->easy = (SessionHandle *)conn->recv_pipe->head->ptr;
                }
              }
              if (((conn->send_pipe != (curl_llist *)0x0) && (1 < conn->send_pipe->size)) &&
                 (bVar4 = false, _num->easy == data)) {
                _Var2 = Curl_sendpipe_head(data,conn);
                if (_Var2) {
                  _num->easy = (SessionHandle *)conn->send_pipe->head->next->ptr;
                }
                else {
                  _num->easy = (SessionHandle *)conn->send_pipe->head->ptr;
                }
              }
            }
          }
          if (bVar4) {
            if (multi->socket_cb != (curl_socket_callback)0x0) {
              (*multi->socket_cb)(data,curraction,4,multi->socket_userp,_num->socketp);
            }
            sh_delentry(&multi->sockhash,curraction);
          }
        }
        entry._4_4_ = entry._4_4_ + 1;
      } while( true );
    }
    curraction = (&local_38)[entry._4_4_];
    _num = (Curl_sh_entry *)Curl_hash_pick(&multi->sockhash,&curraction,4);
    easy_conn._4_4_ = (uint)((uVar3 & 1 << ((byte)entry._4_4_ & 0x1f)) != 0);
    if ((uVar3 & 1 << ((byte)entry._4_4_ + 0x10 & 0x1f)) != 0) {
      easy_conn._4_4_ = easy_conn._4_4_ | 2;
    }
    if (_num == (Curl_sh_entry *)0x0) {
      _num = sh_addentry(&multi->sockhash,curraction,data);
      if (_num == (Curl_sh_entry *)0x0) {
        return;
      }
LAB_00884b64:
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        (*multi->socket_cb)(data,curraction,easy_conn._4_4_,multi->socket_userp,_num->socketp);
      }
      _num->action = easy_conn._4_4_;
    }
    else if (_num->action != easy_conn._4_4_) goto LAB_00884b64;
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

static void singlesocket(struct Curl_multi *multi,
                         struct SessionHandle *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  bool remove_sock_from_hash;

  for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i=0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = Curl_hash_pick(&multi->sockhash, (char *)&s, sizeof(s));

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(&multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i=0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j=0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }
    if(s != CURL_SOCKET_BAD) {

      /* this socket has been removed. Tell the app to remove it */
      remove_sock_from_hash = TRUE;

      entry = Curl_hash_pick(&multi->sockhash, (char *)&s, sizeof(s));
      if(entry) {
        /* check if the socket to be removed serves a connection which has
           other easy-s in a pipeline. In this case the socket should not be
           removed. */
        struct connectdata *easy_conn = data->easy_conn;
        if(easy_conn) {
          if(easy_conn->recv_pipe && easy_conn->recv_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the recv_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(Curl_recvpipe_head(data, easy_conn))
                entry->easy = easy_conn->recv_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->recv_pipe->head->ptr;
            }
          }
          if(easy_conn->send_pipe  && easy_conn->send_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the send_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(Curl_sendpipe_head(data, easy_conn))
                entry->easy = easy_conn->send_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->send_pipe->head->ptr;
            }
          }
          /* Don't worry about overwriting recv_pipe head with send_pipe_head,
             when action will be asked on the socket (see multi_socket()), the
             head of the correct pipe will be taken according to the
             action. */
        }
      }
      else
        /* just a precaution, this socket really SHOULD be in the hash already
           but in case it isn't, we don't have to tell the app to remove it
           either since it never got to know about it */
        remove_sock_from_hash = FALSE;

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }

    }
  }

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
}